

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexMin2.c
# Opt level: O2

void Gia_ManAddTwo(Gia_Man_t *p,int iFrame,Gia_Obj_t *pObj,int Value)

{
  int iVar1;
  Vec_Int_t *p_00;
  int iVar2;
  int *piVar3;
  
  p_00 = p->vTruths;
  iVar1 = p->nTtWords;
  iVar2 = Gia_ObjId(p,pObj);
  piVar3 = Vec_IntEntryP(p_00,iFrame * iVar1);
  piVar3[iVar2 >> 4] = piVar3[iVar2 >> 4] | Value << ((char)iVar2 * '\x02' & 0x1fU);
  return;
}

Assistant:

static inline void Gia_ManAddTwo( Gia_Man_t * p, int iFrame, Gia_Obj_t * pObj, int Value )   { Abc_InfoAdd2Bits( p->vTruths, p->nTtWords, iFrame, Gia_ObjId(p, pObj), Value ); }